

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_>::SetMemoryIndices
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_> *this,TPZVec<long> *indices)

{
  long lVar1;
  int64_t iVar2;
  long *plVar3;
  TPZVec<long> *in_RSI;
  long in_RDI;
  int64_t in_stack_00000008;
  int i;
  int n;
  undefined4 local_18;
  
  iVar2 = TPZVec<long>::size(in_RSI);
  TPZManVector<long,_128>::Resize(_i,in_stack_00000008);
  for (local_18 = 0; local_18 < (int)iVar2; local_18 = local_18 + 1) {
    plVar3 = TPZVec<long>::operator[](in_RSI,(long)local_18);
    lVar1 = *plVar3;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xe8),(long)local_18);
    *plVar3 = lVar1;
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetMemoryIndices(TPZVec<int64_t> &indices) {
    int n = indices.size();
    fIntPtIndices.Resize(n);
    for (int i = 0; i < n; i++) {
        fIntPtIndices[i] = indices[i];
    }
}